

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_stream_socket.c
# Opt level: O1

void oonf_stream_remove(oonf_stream_socket *stream_socket,_Bool force)

{
  int __fd;
  list_entity *plVar1;
  list_entity *plVar2;
  _func_void_oonf_stream_socket_ptr *UNRECOVERED_JUMPTABLE;
  
  if (stream_socket->busy == true && !force) {
    stream_socket->remove = true;
  }
  else if (((stream_socket->_node).next != (list_entity *)0x0) &&
          ((stream_socket->_node).prev != (list_entity *)0x0)) {
    oonf_stream_close_all_sessions(stream_socket);
    plVar1 = (stream_socket->_node).next;
    plVar2 = (stream_socket->_node).prev;
    plVar2->next = plVar1;
    plVar1->prev = plVar2;
    (stream_socket->_node).next = (list_entity *)0x0;
    (stream_socket->_node).prev = (list_entity *)0x0;
    oonf_socket_remove(&stream_socket->scheduler_entry);
    __fd = (stream_socket->scheduler_entry).fd.fd;
    if (__fd != -1) {
      close(__fd);
      (stream_socket->scheduler_entry).fd.fd = -1;
    }
    UNRECOVERED_JUMPTABLE = (stream_socket->config).cleanup_socket;
    if (UNRECOVERED_JUMPTABLE != (_func_void_oonf_stream_socket_ptr *)0x0) {
      (*UNRECOVERED_JUMPTABLE)(stream_socket);
      return;
    }
  }
  return;
}

Assistant:

void
oonf_stream_remove(struct oonf_stream_socket *stream_socket, bool force) {
  if (stream_socket->busy && !force) {
    stream_socket->remove = true;
    return;
  }

  if (!list_is_node_added(&stream_socket->_node)) {
    return;
  }

  oonf_stream_close_all_sessions(stream_socket);
  list_remove(&stream_socket->_node);

  oonf_socket_remove(&stream_socket->scheduler_entry);
  os_fd_close(&stream_socket->scheduler_entry.fd);

  if (stream_socket->config.cleanup_socket) {
    stream_socket->config.cleanup_socket(stream_socket);
  }
}